

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetKerningTable(stbtt_fontinfo *info,stbtt_kerningentry *table,int table_length)

{
  int iVar1;
  uchar *puVar2;
  stbtt_uint16 sVar3;
  stbtt_int16 sVar4;
  uint local_38;
  int local_34;
  int length;
  int k;
  stbtt_uint8 *data;
  int table_length_local;
  stbtt_kerningentry *table_local;
  stbtt_fontinfo *info_local;
  
  puVar2 = info->data;
  iVar1 = info->kern;
  if (info->kern == 0) {
    info_local._4_4_ = 0;
  }
  else {
    sVar3 = ttUSHORT(puVar2 + (long)iVar1 + 2);
    if (sVar3 == 0) {
      info_local._4_4_ = 0;
    }
    else {
      sVar3 = ttUSHORT(puVar2 + (long)iVar1 + 8);
      if (sVar3 == 1) {
        sVar3 = ttUSHORT(puVar2 + (long)iVar1 + 10);
        local_38 = (uint)sVar3;
        if (table_length < (int)local_38) {
          local_38 = table_length;
        }
        for (local_34 = 0; local_34 < (int)local_38; local_34 = local_34 + 1) {
          sVar3 = ttUSHORT(puVar2 + (long)(local_34 * 6) + (long)iVar1 + 0x12);
          table[local_34].glyph1 = (uint)sVar3;
          sVar3 = ttUSHORT(puVar2 + (long)(local_34 * 6) + (long)iVar1 + 0x14);
          table[local_34].glyph2 = (uint)sVar3;
          sVar4 = ttSHORT(puVar2 + (long)(local_34 * 6) + (long)iVar1 + 0x16);
          table[local_34].advance = (int)sVar4;
        }
        info_local._4_4_ = local_38;
      }
      else {
        info_local._4_4_ = 0;
      }
    }
  }
  return info_local._4_4_;
}

Assistant:

STBTT_DEF int stbtt_GetKerningTable(const stbtt_fontinfo *info, stbtt_kerningentry* table, int table_length)
{
   stbtt_uint8 *data = info->data + info->kern;
   int k, length;

   // we only look at the first table. it must be 'horizontal' and format 0.
   if (!info->kern)
      return 0;
   if (ttUSHORT(data+2) < 1) // number of tables, need at least 1
      return 0;
   if (ttUSHORT(data+8) != 1) // horizontal flag must be set in format
      return 0;

   length = ttUSHORT(data+10);
   if (table_length < length)
      length = table_length;

   for (k = 0; k < length; k++)
   {
      table[k].glyph1 = ttUSHORT(data+18+(k*6));
      table[k].glyph2 = ttUSHORT(data+20+(k*6));
      table[k].advance = ttSHORT(data+22+(k*6));
   }

   return length;
}